

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<duckdb::dtime_t,duckdb::dtime_tz_t>(dtime_t input)

{
  bool bVar1;
  undefined8 in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  dtime_t in_stack_fffffffffffffdf8;
  dtime_t input_00;
  string local_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [7];
  PhysicalType in_stack_fffffffffffffedf;
  string local_108 [32];
  undefined8 local_e8;
  string local_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = TypeIsNumber<duckdb::dtime_t>();
  if ((bVar1) && (bVar1 = TypeIsNumber<duckdb::dtime_tz_t>(), bVar1)) {
    GetTypeId<duckdb::dtime_t>();
    input_00.micros = (int64_t)&local_b0;
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+((char *)input_00.micros,in_stack_fffffffffffffdf0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     input_00.micros,(char *)in_stack_fffffffffffffdf0);
    local_e8 = local_10;
    ConvertToString::Operation<duckdb::dtime_t>(input_00);
    ::std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     input_00.micros,(char *)in_stack_fffffffffffffdf0);
    GetTypeId<duckdb::dtime_tz_t>();
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::~string(local_30);
    ::std::__cxx11::string::~string(local_50);
    ::std::__cxx11::string::~string(local_e0);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::~string(local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    GetTypeId<duckdb::dtime_t>();
    __rhs = &local_1a8;
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+((char *)in_stack_fffffffffffffdf8.micros,__rhs);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdf8.micros,(char *)__rhs);
    ConvertToString::Operation<duckdb::dtime_t>(in_stack_fffffffffffffdf8);
    ::std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdf8.micros,(char *)__rhs);
    GetTypeId<duckdb::dtime_tz_t>();
    TypeIdToString_abi_cxx11_(in_stack_fffffffffffffedf);
    ::std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::__cxx11::string::~string(local_128);
    ::std::__cxx11::string::~string(local_148);
    ::std::__cxx11::string::~string(local_1c8);
    ::std::__cxx11::string::~string(local_168);
    ::std::__cxx11::string::~string(local_188);
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}